

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.c
# Opt level: O2

void do_func(int *ip)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  
  if (pass == 1) {
    if ((((list_level == 0) || (xlist == 0)) || (asm_opt[0] == 0)) ||
       ((expand_macro != 0 && (asm_opt[1] == 0)))) {
      return;
    }
    if (continued_line != 0) {
      strcpy(prlnbuf,tmplnbuf);
    }
    if (data_loccnt != -1) {
      iVar1 = 0;
      loadlc(data_loccnt,0);
      iVar2 = loccnt - data_loccnt;
      if (data_level <= list_level || iVar2 < 4) {
        if (iVar2 < 1) {
          iVar2 = 0;
        }
        while (iVar3 = data_loccnt, bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
          if ((long)bank < 0xf0) {
            hexcon(2,(uint)rom[bank][data_loccnt],prlnbuf + (long)(iVar1 * 3) + 0x10);
          }
          else {
            (prlnbuf + (long)iVar1 * 3 + 0x10)[0] = '-';
            (prlnbuf + (long)iVar1 * 3 + 0x10)[1] = '-';
            iVar3 = data_loccnt;
          }
          data_loccnt = iVar3 + 1;
          iVar1 = iVar1 + 1;
          if (iVar1 == data_size) {
            iVar1 = 0;
            fprintf((FILE *)lst_fp,"%s\n",prlnbuf);
            builtin_strncpy(prlnbuf,"                          ",0x1a);
            prlnbuf[0x1b] = '\0';
            loadlc(data_loccnt,0);
          }
        }
        if (iVar1 == 0) {
          return;
        }
      }
    }
    fprintf((FILE *)lst_fp,"%s\n",prlnbuf);
    return;
  }
  if (lablptr == (t_symbol *)0x0) {
    error("No name for this function!");
    return;
  }
  if (lablptr->refcnt != 0) {
    if (lablptr->type != 6) {
      if (lablptr->type != 5) {
        fatal_error("Symbol already used by a label!");
        return;
      }
      fatal_error("Symbol already used by a macro!");
    }
    fatal_error("Function already defined!");
    return;
  }
  func_install(*ip);
  return;
}

Assistant:

void
do_func(int *ip)
{
	if (pass == LAST_PASS)
		println();
	else {
		/* error checking */
		if (lablptr == NULL) {
			error("No name for this function!");
			return;
		}
		if (lablptr->refcnt) {
			switch (lablptr->type) {
			case MACRO:
				fatal_error("Symbol already used by a macro!");

			case FUNC:
				fatal_error("Function already defined!");
				return;

			default:
				fatal_error("Symbol already used by a label!");
				return;
			}
		}

		/* install this new function in the hash table */
		if (!func_install(*ip))
			return;
	} 
}